

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DeviceContextBase
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          DeviceImplType *pRenderDevice,DeviceContextDesc *Desc)

{
  undefined8 *puVar1;
  Bool BVar2;
  uint uVar3;
  Uint8 UVar4;
  Uint8 UVar5;
  char (*Args_1) [21];
  char *pcVar6;
  long lVar7;
  string msg;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ObjectBase<Diligent::IDeviceContextVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IDeviceContextVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IDeviceContextVk>).
  super_RefCountedObject<Diligent::IDeviceContextVk>.super_IDeviceContextVk.super_IDeviceContext.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00892b58;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::RefCntAutoPtr(&this->m_pDevice,pRenderDevice);
  local_78 = &this->m_pPipelineState;
  lVar7 = 0;
  memset(this->m_VertexStreams,0,0x204);
  (this->m_pPipelineState).m_pObject = (PipelineStateVkImpl *)0x0;
  (this->m_pIndexBuffer).m_pObject = (BufferVkImpl *)0x0;
  *(undefined8 *)((long)&(this->m_pIndexBuffer).m_pObject + 4) = 0;
  *(undefined8 *)((long)&this->m_IndexDataStartOffset + 4) = 0;
  this->m_BlendFactors[0] = -1.0;
  this->m_BlendFactors[1] = -1.0;
  this->m_BlendFactors[2] = -1.0;
  this->m_BlendFactors[3] = -1.0;
  do {
    puVar1 = (undefined8 *)((long)&this->m_Viewports[0].TopLeftX + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&this->m_Viewports[0].MinDepth + lVar7) = 0x3f80000000000000;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x180);
  memset(&this->m_NumViewports,0,0x108);
  this->m_pBoundRenderTargets[0].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[1].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[2].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[3].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[4].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[5].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[6].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_pBoundRenderTargets[7].m_pObject = (TextureViewVkImpl *)0x0;
  this->m_NumBoundRenderTargets = 0;
  this->m_FramebufferWidth = 0;
  this->m_FramebufferHeight = 0;
  this->m_FramebufferSlices = 0;
  this->m_FramebufferSamples = 0;
  (this->m_pActiveRenderPass).m_pObject = (RenderPassVkImpl *)0x0;
  (this->m_pBoundShadingRateMap).m_pObject = (ITextureView *)0x0;
  *(undefined8 *)((long)&(this->m_pBoundShadingRateMap).m_pObject + 5) = 0;
  (this->m_pBoundDepthStencil).m_pObject = (TextureViewVkImpl *)0x0;
  (this->m_pBoundFramebuffer).m_pObject = (FramebufferVkImpl *)0x0;
  this->m_FrameNumber = 0;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  pcVar6 = Desc->Name;
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    std::__cxx11::string::string((string *)&local_50,"Context #",&local_a1);
    std::__cxx11::to_string(&local_70,(uint)Desc->ContextId);
    std::operator+(&local_a0,&local_50,&local_70);
    pcVar6 = " (immediate)";
    if (Desc->IsDeferred != false) {
      pcVar6 = " (deferred)";
    }
    std::operator+(&this->m_Name,&local_a0,pcVar6);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&this->m_Name,pcVar6,(allocator *)&local_a0);
  }
  BVar2 = Desc->IsDeferred;
  Args_1 = (char (*) [21])0x0;
  if (BVar2 == false) {
    uVar3._0_1_ = Desc->QueueType;
    uVar3._1_1_ = Desc->IsDeferred;
    uVar3._2_1_ = Desc->ContextId;
    uVar3._3_1_ = Desc->QueueId;
    Args_1 = (char (*) [21])(ulong)uVar3;
  }
  UVar4 = Desc->ContextId;
  UVar5 = Desc->QueueId;
  (this->m_Desc).TextureCopyGranularity[2] = 0;
  (this->m_Desc).TextureCopyGranularity[0] = 0;
  (this->m_Desc).TextureCopyGranularity[1] = 0;
  (this->m_Desc).Name = (this->m_Name)._M_dataplus._M_p;
  (this->m_Desc).QueueType = (COMMAND_QUEUE_TYPE)Args_1;
  (this->m_Desc).IsDeferred = BVar2;
  (this->m_Desc).ContextId = UVar4;
  (this->m_Desc).QueueId = UVar5;
  if (BVar2 == false) {
    (this->m_Desc).TextureCopyGranularity[0] = 1;
    (this->m_Desc).TextureCopyGranularity[1] = 1;
    (this->m_Desc).TextureCopyGranularity[2] = 1;
  }
  this->m_NativeMultiDrawSupported =
       (pRenderDevice->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.NativeMultiDraw
       != DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DstImmediateContextId).m_Value = 0xff;
  memset(&this->m_Stats,0,0x164);
  (this->m_DbgMappedBuffers)._M_h._M_buckets = &(this->m_DbgMappedBuffers)._M_h._M_single_bucket;
  (this->m_DbgMappedBuffers)._M_h._M_bucket_count = 1;
  (this->m_DbgMappedBuffers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_DbgMappedBuffers)._M_h._M_element_count = 0;
  (this->m_DbgMappedBuffers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->m_DvpRenderTargetFormatsHash = 0;
  this->m_DvpDebugGroupCount = 0;
  (this->m_DbgMappedBuffers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_DbgMappedBuffers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((this->m_pDevice).m_pObject == (RenderDeviceVkImpl *)0x0) {
    FormatString<char[26],char[21]>
              (&local_a0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pDevice != nullptr",Args_1);
    DebugAssertionFailed
              (local_a0._M_dataplus._M_p,"DeviceContextBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return;
}

Assistant:

DeviceContextBase(IReferenceCounters*      pRefCounters,
                      DeviceImplType*          pRenderDevice,
                      const DeviceContextDesc& Desc) :
        // clang-format off
        TObjectBase{pRefCounters },
        m_pDevice  {pRenderDevice},
        m_Name
        {
            Desc.Name != nullptr && *Desc.Name != '\0' ?
                String{Desc.Name} :
                String{"Context #"} + std::to_string(Uint32{Desc.ContextId}) + (Desc.IsDeferred ? " (deferred)" : " (immediate)")
        },
        m_Desc
        {
            m_Name.c_str(),
            Desc.IsDeferred ? COMMAND_QUEUE_TYPE_UNKNOWN : Desc.QueueType,
            Desc.IsDeferred,
            Desc.ContextId,
            Desc.QueueId
        },
        m_NativeMultiDrawSupported{pRenderDevice->GetDeviceInfo().Features.NativeMultiDraw != DEVICE_FEATURE_STATE_DISABLED}
    // clang-format on
    {
        VERIFY_EXPR(m_pDevice != nullptr);
    }